

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<double> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  uint uVar1;
  basic_appender<char> bVar2;
  undefined8 uVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  buffer<char> *buf;
  uint uVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  undefined8 uVar10;
  int iVar11;
  ulong uVar12;
  size_t sVar13;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  int exp;
  significand_type significand;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_da [2];
  bool local_d8 [4];
  int local_d4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  int local_a0;
  char cStack_9c;
  undefined2 uStack_9a;
  _Alloc_hider local_98;
  format_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c0 = (undefined1  [8])f->significand;
  lVar4 = 0x3f;
  if (((ulong)local_c0 | 1) != 0) {
    for (; ((ulong)local_c0 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  local_d4 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar4] -
             (uint)((ulong)local_c0 <
                   (ulong)*(basic_specs *)
                           (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                           (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar4] * 8));
  local_da[1] = '0';
  local_d0._M_allocated_capacity._0_4_ = s;
  if (-1 < local_d4) {
    uVar6 = (local_d4 + 1) - (uint)(s == none);
    uVar12 = (ulong)uVar6;
    local_da[0] = '.';
    local_d0._8_8_ = out.container;
    if (((specs->super_basic_specs).data_ & 0x4000) != 0) {
      local_da[0] = decimal_point_impl<char>(loc);
    }
    uVar10 = _local_a0;
    uVar3 = local_d0._8_8_;
    iVar8 = f->exponent;
    local_d0._M_allocated_capacity._4_4_ = local_d4 + iVar8;
    uVar1 = (specs->super_basic_specs).data_;
    iVar11 = specs->precision;
    bVar7 = (byte)uVar1 & 7;
    if (bVar7 == 1) goto LAB_001e14be;
    if ((uVar1 & 7) != 2) {
      if ((int)local_d0._M_allocated_capacity._4_4_ < -3) {
LAB_001e14be:
        iVar8 = local_d4 + iVar8 + -1;
        if ((uVar1 >> 0xd & 1) == 0) {
          iVar9 = 0;
          if (local_d4 == 1) {
            local_da[0] = '\0';
            iVar9 = 0;
          }
        }
        else {
          iVar9 = 0;
          if (0 < iVar11 - local_d4) {
            iVar9 = iVar11 - local_d4;
          }
          uVar12 = (ulong)(uVar6 + iVar9);
        }
        iVar11 = 1 - local_d0._M_allocated_capacity._4_4_;
        if (0 < (int)local_d0._M_allocated_capacity._4_4_) {
          iVar11 = iVar8;
        }
        lVar4 = 2;
        if (99 < iVar11) {
          lVar4 = (ulong)(999 < iVar11) + 3;
        }
        sVar13 = lVar4 + (3 - (ulong)(local_da[0] == '\0')) + uVar12;
        local_b8._0_4_ = local_d0._0_4_;
        local_b8._8_8_ = local_c0;
        local_a8[4] = local_da[0];
        local_a8._0_4_ = local_d4;
        _local_a0 = CONCAT14('0',iVar9);
        uStack_9a = SUB82(uVar10,6);
        _local_a0 = CONCAT26(uStack_9a,CONCAT15(((uVar1 >> 0xc & 1) == 0) << 5,_local_a0)) |
                    0x450000000000;
        local_98._M_p._0_4_ = iVar8;
        if (specs->width < 1) {
          uVar12 = sVar13 + *(size_t *)(local_d0._8_8_ + 8);
          if (*(size_t *)(local_d0._8_8_ + 0x10) < uVar12) {
            (**(grow_fun *)(local_d0._8_8_ + 0x18))((buffer<char> *)local_d0._8_8_,uVar12);
          }
          bVar2 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<double>,_fmt::v11::detail::digit_grouping<char>_>
                  ::anon_class_40_8_fd1bf2f9::operator()
                            ((anon_class_40_8_fd1bf2f9 *)local_b8,(iterator)uVar3);
        }
        else {
          bVar2 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                            ((basic_appender<char>)local_d0._8_8_,specs,sVar13,sVar13,
                             (anon_class_40_8_fd1bf2f9 *)local_b8);
        }
        return (basic_appender<char>)bVar2.container;
      }
      if (0 < iVar11) {
        exp_upper = iVar11;
      }
      if (exp_upper < (int)local_d0._M_allocated_capacity._4_4_) goto LAB_001e14be;
    }
    if (iVar8 < 0) {
      if ((int)local_d0._M_allocated_capacity._4_4_ < 1) {
        local_70._M_allocated_capacity._0_4_ = -local_d0._M_allocated_capacity._4_4_;
        if ((local_d4 == 0) &&
           (SBORROW4(iVar11,-local_d0._M_allocated_capacity._4_4_) !=
            iVar11 + local_d0._M_allocated_capacity._4_4_ < 0 && -1 < iVar11)) {
          local_70._M_allocated_capacity._0_4_ = iVar11;
        }
        uVar6 = 1;
        if (local_d4 == 0 && local_70._0_4_ == 0) {
          uVar6 = uVar1 >> 0xd & 1;
        }
        local_d8[0] = (bool)(char)uVar6;
        if (-1 < (int)local_70._0_4_) {
          sVar13 = (local_70._0_4_ + uVar6 + 1) + uVar12;
          local_b8._0_8_ = &local_d0;
          local_b8._8_8_ = local_d8;
          local_a8 = (undefined1  [8])local_da;
          _local_a0 = &local_70;
          local_98._M_p = local_da + 1;
          local_90 = (format_specs *)local_c0;
          local_88._M_allocated_capacity = (size_type)&local_d4;
          bVar2 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                            ((basic_appender<char>)local_d0._8_8_,specs,sVar13,sVar13,
                             (anon_class_56_7_88befd79 *)local_b8);
          return (basic_appender<char>)bVar2.container;
        }
        goto LAB_001e178b;
      }
      uVar6 = iVar11 - local_d4 & (int)(uVar1 << 0x12) >> 0x1f;
      local_d8 = (bool  [4])uVar6;
      digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                ((digit_grouping<char> *)local_b8,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
      iVar8 = 0;
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      sVar13 = uVar6 + uVar12;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_b8._0_8_;
      do {
        iVar11 = 0x7fffffff;
        if (local_90 != (format_specs *)0x0) {
          if (paVar5 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_b8._8_8_ + local_b8._0_8_)) {
            uVar6 = (uint)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(local_b8._8_8_ + local_b8._0_8_))->_M_local_buf[-1];
          }
          else {
            bVar7 = paVar5->_M_local_buf[0];
            if ((byte)(bVar7 + 0x81) < 0x82) goto LAB_001e1631;
            paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar5->_M_local_buf + 1);
            uVar6 = (uint)bVar7;
          }
          iVar8 = iVar8 + uVar6;
          iVar11 = iVar8;
        }
LAB_001e1631:
        sVar13 = sVar13 + 1;
      } while (iVar11 < (int)local_d0._M_allocated_capacity._4_4_);
      local_70._M_allocated_capacity = (size_type)&local_d0;
      local_70._8_8_ = local_c0;
      local_60._M_allocated_capacity = (size_type)&local_d4;
      local_60._8_8_ = local_d0._M_local_buf + 4;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_da;
      local_40._M_allocated_capacity = (size_type)local_d8;
      local_40._8_8_ = local_da + 1;
      local_48 = (digit_grouping<char> *)local_b8;
      bVar2 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                        ((basic_appender<char>)local_d0._8_8_,specs,sVar13,sVar13,
                         (anon_class_64_8_085c650e *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,(ulong)(local_88._M_allocated_capacity + 1));
      }
      uVar3 = local_a8;
      uVar10 = local_b8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_b8 + 0x10)) {
        return (basic_appender<char>)bVar2.container;
      }
    }
    else {
      uVar12 = (ulong)(iVar8 + uVar6);
      local_d8 = (bool  [4])(iVar11 - local_d0._M_allocated_capacity._4_4_);
      if ((uVar1 >> 0xd & 1) != 0) {
        if (bVar7 != 2 && (int)local_d8 < 1) {
          local_d8[0] = false;
          local_d8[1] = false;
          local_d8[2] = false;
          local_d8[3] = false;
        }
        uVar12 = uVar12 + 1;
        if (0 < (long)(int)local_d8) {
          uVar12 = uVar12 + (long)(int)local_d8;
        }
      }
      digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar1 >> 0xe) & 1));
      sVar13 = uVar12 - 1;
      iVar8 = 0;
      uVar3 = local_70._0_8_;
      do {
        iVar11 = 0x7fffffff;
        if (local_48 != (digit_grouping<char> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_70._8_8_ + local_70._0_8_)) {
            uVar6 = (uint)(char)*(byte *)((long)(local_70._8_8_ + local_70._0_8_) + -1);
          }
          else {
            bVar7 = *(byte *)uVar3;
            if ((byte)(bVar7 + 0x81) < 0x82) goto LAB_001e1403;
            uVar3 = uVar3 + 1;
            uVar6 = (uint)bVar7;
          }
          iVar8 = iVar8 + uVar6;
          iVar11 = iVar8;
        }
LAB_001e1403:
        sVar13 = sVar13 + 1;
      } while (iVar11 < (int)local_d0._M_allocated_capacity._4_4_);
      local_b8._0_8_ = &local_d0;
      local_b8._8_8_ = local_c0;
      local_a8 = (undefined1  [8])&local_d4;
      local_88._M_allocated_capacity = (size_type)local_da;
      local_88._8_8_ = local_d8;
      local_78 = local_da + 1;
      _local_a0 = f;
      local_98._M_p = (pointer)&local_70;
      local_90 = specs;
      bVar2 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                        ((basic_appender<char>)local_d0._8_8_,specs,sVar13,sVar13,
                         (anon_class_72_9_eb40e20e *)local_b8);
      if (local_50 != &local_40) {
        operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
      }
      uVar3 = local_60._M_allocated_capacity;
      uVar10 = local_70._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._0_8_ == &local_60) {
        return (basic_appender<char>)bVar2.container;
      }
    }
    operator_delete((void *)uVar10,uVar3 + 1);
    return (basic_appender<char>)bVar2.container;
  }
LAB_001e178b:
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/base.h"
              ,0x1b6,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}